

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::eval::Inline_Array_AST_Node::eval_internal
          (Inline_Array_AST_Node *this,Dispatch_State *t_ss)

{
  Type_Conversions_State *t_conversions;
  Dispatch_Engine *pDVar1;
  long lVar2;
  undefined8 *puVar3;
  string *t_name;
  undefined8 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 *puVar4;
  Boxed_Value BVar5;
  initializer_list<chaiscript::Boxed_Value> __l;
  Boxed_Value obj;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> vec;
  allocator_type local_c9;
  Dispatch_State *local_c8;
  __atomic_base<unsigned_long> local_c0 [2];
  long local_b0 [2];
  Boxed_Value local_a0;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_90;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  File_Position local_60;
  undefined1 local_58 [40];
  
  local_88.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar1 = t_ss[3].m_engine._M_data;
  local_c8 = t_ss;
  local_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  if (pDVar1 != (Dispatch_Engine *)t_ss[3].m_stack_holder._M_data) {
    lVar2 = (pDVar1->m_mutex).super_mutex.super___mutex_base._M_mutex.__align;
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::reserve
              (&local_88,*(long *)(lVar2 + 0x68) - *(long *)(lVar2 + 0x60) >> 4);
    lVar2 = ((local_c8[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base._M_mutex.
            __align;
    puVar4 = *(undefined8 **)(lVar2 + 0x60);
    puVar3 = *(undefined8 **)(lVar2 + 0x68);
    if (puVar4 != puVar3) {
      local_c8 = (Dispatch_State *)&local_c8[4].m_stack_holder;
      local_60 = (File_Position)(in_RDX + 2);
      t_conversions = (Type_Conversions_State *)(local_58 + 0x10);
      do {
        AST_Node::eval((AST_Node *)&local_a0,(Dispatch_State *)*puVar4);
        if ((local_a0.m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            m_return_value == false) {
          t_name = (string *)*in_RDX;
          local_c0[0]._M_i = (__int_type_conflict1)local_b0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"clone","");
          local_70._M_allocated_capacity =
               (size_type)
               local_a0.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_70._8_8_ =
               local_a0.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if ((element_type *)
              local_a0.m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&(((enable_shared_from_this<chaiscript::AST_Node> *)
                        &(local_a0.m_data.
                          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_use_count)->_M_weak_this).
                       super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(int *)&(((enable_shared_from_this<chaiscript::AST_Node> *)
                             &(local_a0.m_data.
                               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi)->_M_use_count)->_M_weak_this).
                            super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 1;
              UNLOCK();
            }
            else {
              *(int *)&(((enable_shared_from_this<chaiscript::AST_Node> *)
                        &(local_a0.m_data.
                          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_use_count)->_M_weak_this).
                       super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(int *)&(((enable_shared_from_this<chaiscript::AST_Node> *)
                             &(local_a0.m_data.
                               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi)->_M_use_count)->_M_weak_this).
                            super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 1;
            }
          }
          __l._M_len = 1;
          __l._M_array = (iterator)&local_70;
          std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
                    ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                     t_conversions,__l,&local_c9);
          chaiscript::detail::Dispatch_Engine::call_function
                    ((Dispatch_Engine *)local_58,t_name,(atomic_uint_fast32_t *)local_c0,
                     (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                     local_c8,t_conversions);
          std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
          emplace_back<chaiscript::Boxed_Value>(&local_88,(Boxed_Value *)local_58);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
          }
          std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
                    ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                     t_conversions);
          if ((element_type *)local_70._8_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
          }
          if ((long *)local_c0[0]._M_i != local_b0) {
            operator_delete((void *)local_c0[0]._M_i,local_b0[0] + 1);
          }
        }
        else {
          std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
          emplace_back<chaiscript::Boxed_Value>(&local_88,&local_a0);
        }
        if ((element_type *)
            local_a0.m_data.
            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a0.m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        puVar4 = puVar4 + 2;
      } while (puVar4 != puVar3);
    }
  }
  chaiscript::detail::
  const_var_impl<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
            ((detail *)local_90._M_pi,&local_88);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector(&local_88)
  ;
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)local_90._M_pi;
  return (Boxed_Value)
         BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE {
          try {
            std::vector<Boxed_Value> vec;
            if (!children.empty()) {
              vec.reserve(children[0]->children.size());
              for (const auto &child : children[0]->children) {
                auto obj = child->eval(t_ss);
                if (!obj.is_return_value()) {
                  vec.push_back(t_ss->call_function("clone", m_loc, {obj}, t_ss.conversions()));
                } else {
                  vec.push_back(std::move(obj));
                }
              }
            }
            return const_var(std::move(vec));
          }
          catch (const exception::dispatch_error &) {
            throw exception::eval_error("Can not find appropriate 'clone' or copy constructor for vector elements");
          }
        }